

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Text>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  word *pwVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *unaff_R12;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *pDVar8;
  WirePointer *pWVar9;
  WirePointer *pWVar10;
  WirePointer *pWVar11;
  bool bVar12;
  Reader RVar13;
  SegmentReader *newSegment;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *local_48;
  uint size;
  ByteCount local_34;
  
  local_48 = this->segment;
  pWVar9 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar9 = this->pointer;
  }
  pWVar10 = pWVar9 + 1;
  lVar6 = (long)((int)*(uint64_t *)&(pWVar9->offsetAndKind).value >> 2);
  if (local_48 == (SegmentReader *)0x0) {
    pWVar11 = pWVar10 + lVar6;
  }
  else {
    pwVar1 = (local_48->ptr).ptr;
    pWVar11 = (WirePointer *)(pwVar1 + (local_48->ptr).size_);
    if (((long)pwVar1 - (long)pWVar10 >> 3 <= lVar6) &&
       (lVar6 <= (long)pWVar11 - (long)pWVar10 >> 3)) {
      pWVar11 = pWVar10 + lVar6;
    }
  }
  uVar7 = (uint)*(uint64_t *)&(pWVar9->offsetAndKind).value;
  if ((pWVar9->field_1).upper32Bits != 0 || uVar7 != 0) {
    pWVar10 = pWVar9;
    if ((local_48 != (SegmentReader *)0x0) && ((uVar7 & 3) == 2)) {
      iVar3 = (*local_48->arena->_vptr_Arena[2])();
      local_48 = (SegmentReader *)CONCAT44(extraout_var,iVar3);
      _kjCondition.left = &local_48;
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = local_48 != (SegmentReader *)0x0;
      if (local_48 == (SegmentReader *)0x0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  ((Fault *)&newSegment,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition
                   ,(char (*) [49])"Message contains far pointer to unknown segment.");
        unaff_R12 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      }
      else {
        uVar7 = (uint)*(uint64_t *)&(pWVar9->offsetAndKind).value;
        uVar4 = (ulong)(uVar7 >> 3);
        uVar5 = (local_48->ptr).size_;
        if ((long)uVar5 < (long)uVar4) {
          uVar4 = uVar5;
        }
        pWVar10 = (WirePointer *)((local_48->ptr).ptr + uVar4);
        if (local_48 == (SegmentReader *)0x0) {
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,1);
LAB_0015f10b:
          if ((*(uint64_t *)&(pWVar9->offsetAndKind).value & 4) == 0) {
            pWVar9 = pWVar10 + 1;
            lVar6 = (long)((int)*(uint64_t *)&(pWVar10->offsetAndKind).value >> 2);
            if (local_48 == (SegmentReader *)0x0) {
              pWVar11 = pWVar9 + lVar6;
            }
            else {
              pwVar1 = (local_48->ptr).ptr;
              pWVar11 = (WirePointer *)(pwVar1 + (local_48->ptr).size_);
              if (((long)pwVar1 - (long)pWVar9 >> 3 <= lVar6) &&
                 (lVar6 <= (long)pWVar11 - (long)pWVar9 >> 3)) {
                pWVar11 = pWVar9 + lVar6;
              }
            }
            goto LAB_0015f2d8;
          }
          iVar3 = (*local_48->arena->_vptr_Arena[2])
                            (local_48->arena,(ulong)(pWVar10->field_1).upper32Bits);
          newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar3);
          _kjCondition.right = (void *)0x0;
          _kjCondition.op.content.ptr = " != ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = newSegment != (SegmentReader *)0x0;
          if (newSegment == (SegmentReader *)0x0) {
            _kjCondition.left = &newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                      ((Fault *)&size,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x25f,FAILED,"newSegment != nullptr",
                       "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                       &_kjCondition,
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_0015f2c5:
            pWVar11 = (WirePointer *)0x0;
            unaff_R12 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&size;
            kj::_::Debug::Fault::~Fault((Fault *)unaff_R12);
          }
          else {
            uVar7 = (uint)*(uint64_t *)&(pWVar10->offsetAndKind).value & 3;
            _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar7);
            _kjCondition.right = anon_var_dwarf_22597;
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ = (size_t)(uVar7 == 2);
            if (uVar7 != 2) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                        ((Fault *)&size,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                         "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                         (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                          *)&_kjCondition,
                         (char (*) [51])"Second word of double-far pad must be far pointer.");
              goto LAB_0015f2c5;
            }
            uVar5 = (ulong)((uint)*(uint64_t *)&(pWVar10->offsetAndKind).value >> 3);
            sVar2 = (newSegment->ptr).size_;
            if ((long)sVar2 < (long)uVar5) {
              uVar5 = sVar2;
            }
            pWVar11 = (WirePointer *)((newSegment->ptr).ptr + uVar5);
            local_48 = newSegment;
          }
          pWVar10 = pWVar10 + 1;
          goto LAB_0015f2d8;
        }
        unaff_R12 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)
                    (2 - (ulong)((uVar7 & 4) == 0));
        if (uVar5 < (long)&unaff_R12->left + uVar4) {
          newSegment = (SegmentReader *)((ulong)newSegment._1_7_ << 8);
        }
        else {
          pDVar8 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)
                   local_48->readLimiter->limit;
          local_34 = defaultSize;
          if (pDVar8 < unaff_R12) {
            (*local_48->arena->_vptr_Arena[3])();
          }
          else {
            local_48->readLimiter->limit = (long)pDVar8 - (long)unaff_R12;
          }
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,unaff_R12 <= pDVar8);
          defaultSize = local_34;
          if (unaff_R12 <= pDVar8) goto LAB_0015f10b;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
        unaff_R12 = &_kjCondition;
      }
      kj::_::Debug::Fault::~Fault((Fault *)unaff_R12);
      pWVar10 = pWVar9;
      pWVar11 = (WirePointer *)0x0;
    }
LAB_0015f2d8:
    pDVar8 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
    bVar12 = pWVar11 == (WirePointer *)0x0;
    if (!bVar12) {
      size = (pWVar10->field_1).upper32Bits >> 3;
      uVar7 = (uint)*(uint64_t *)&(pWVar10->offsetAndKind).value & 3;
      _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar7);
      _kjCondition.right = anon_var_dwarf_22597;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar7 == 1);
      if (uVar7 == 1) {
        _kjCondition.left =
             (SegmentReader **)
             (CONCAT71(_kjCondition.left._1_7_,*(byte *)&pWVar10->field_1) & 0xffffffffffffff07);
        _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
        _kjCondition.right = anon_var_dwarf_22597;
        _kjCondition.op.content.ptr = (char *)0x5;
        bVar12 = (*(byte *)&pWVar10->field_1 & 7) == 2;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar12);
        if (bVar12) {
          if (local_48 == (SegmentReader *)0x0) {
            bVar12 = true;
          }
          else {
            uVar5 = (ulong)(size + 7 >> 3);
            if ((local_48->ptr).size_ < ((long)pWVar11 - (long)(local_48->ptr).ptr >> 3) + uVar5) {
              bVar12 = false;
            }
            else {
              uVar4 = local_48->readLimiter->limit;
              bVar12 = uVar4 >= uVar5;
              if (uVar4 < uVar5) {
                (*local_48->arena->_vptr_Arena[3])();
              }
              else {
                local_48->readLimiter->limit = uVar4 - uVar5;
              }
            }
          }
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar12);
          if (bVar12 == false) {
            pDVar8 = &_kjCondition;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                      ((Fault *)pDVar8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9ac,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                       "_kjCondition,\"Message contained out-of-bounds text pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&newSegment,
                       (char (*) [320])
                       "Message contained out-of-bounds text pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)pDVar8);
            iVar3 = 2;
          }
          else {
            _kjCondition.left = (SegmentReader **)&size;
            _kjCondition.right = (void *)((ulong)_kjCondition.right & 0xffffffff00000000);
            _kjCondition.op.content.ptr = " > ";
            _kjCondition.op.content.size_ = 4;
            _kjCondition.result = size != 0;
            if (_kjCondition.result) {
              uVar5 = (ulong)(size - 1);
              _kjCondition.result = *(char *)((long)&(pWVar11->offsetAndKind).value + uVar5) == '\0'
              ;
              _kjCondition.left = (SegmentReader **)((long)&(pWVar11->offsetAndKind).value + uVar5);
              _kjCondition.op.content.ptr = " == ";
              _kjCondition.op.content.size_ = 5;
              if (_kjCondition.result) {
                iVar3 = 1;
              }
              else {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<char_const&,char>&,char_const(&)[50]>
                          ((Fault *)&newSegment,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x9b7,FAILED,"cptr[unboundedSize] == \'\\0\'",
                           "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                           (DebugComparison<const_char_&,_char> *)&_kjCondition,
                           (char (*) [50])"Message contains text that is not NUL-terminated.");
                kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
                iVar3 = 2;
              }
              pDVar8 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)(uVar5 + 1);
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[50]>
                        ((Fault *)&newSegment,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x9b0,FAILED,"size > ZERO * BYTES",
                         "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                         (DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                         (char (*) [50])"Message contains text that is not NUL-terminated.");
              kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
              iVar3 = 2;
            }
          }
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                    ((Fault *)&newSegment,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9a6,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                     "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where text was \" \"expected.\""
                     ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                     (char (*) [85])
                     "Schema mismatch: Message contains list pointer of non-bytes where text was expected."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
          iVar3 = 2;
          pDVar8 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                  ((Fault *)&newSegment,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9a0,FAILED,"ref->kind() == WirePointer::LIST",
                   "_kjCondition,\"Schema mismatch: Message contains non-list pointer where text was expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    &_kjCondition,
                   (char (*) [76])
                   "Schema mismatch: Message contains non-list pointer where text was expected.");
        kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
        iVar3 = 2;
        pDVar8 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      }
      bVar12 = iVar3 == 2;
      unaff_R12 = pDVar8;
    }
    if (!bVar12) goto LAB_0015f5cf;
  }
  pWVar11 = (WirePointer *)0x1e253d;
  if (defaultValue != (void *)0x0) {
    pWVar11 = (WirePointer *)defaultValue;
  }
  unaff_R12 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)
              ((ulong)defaultSize + 1);
LAB_0015f5cf:
  RVar13.super_StringPtr.content.size_ = (size_t)unaff_R12;
  RVar13.super_StringPtr.content.ptr = (char *)pWVar11;
  return (Reader)RVar13.super_StringPtr.content;
}

Assistant:

Text::Reader PointerReader::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readTextPointer(segment, ref, defaultValue, defaultSize);
}